

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

CaseFold * duckdb_re2::LookupCaseFold(CaseFold *f,int n,Rune r)

{
  int iVar1;
  ulong uVar2;
  CaseFold *pCVar3;
  CaseFold *pCVar4;
  uint uVar5;
  
  pCVar4 = f + n;
  while( true ) {
    if (n < 1) {
      pCVar3 = (CaseFold *)0x0;
      if (f < pCVar4) {
        pCVar3 = f;
      }
      return pCVar3;
    }
    uVar5 = (uint)n >> 1;
    iVar1 = f[uVar5].lo;
    if ((iVar1 <= r) && (r <= f[uVar5].hi)) break;
    n = n - (uVar5 + 1);
    if (r < iVar1) {
      n = uVar5;
    }
    uVar2 = (ulong)(uVar5 + 1);
    if (r < iVar1) {
      uVar2 = 0;
    }
    f = f + uVar2;
  }
  return f + uVar5;
}

Assistant:

const CaseFold* LookupCaseFold(const CaseFold *f, int n, Rune r) {
  const CaseFold* ef = f + n;

  // Binary search for entry containing r.
  while (n > 0) {
    int m = n/2;
    if (f[m].lo <= r && r <= f[m].hi)
      return &f[m];
    if (r < f[m].lo) {
      n = m;
    } else {
      f += m+1;
      n -= m+1;
    }
  }

  // There is no entry that contains r, but f points
  // where it would have been.  Unless f points at
  // the end of the array, it points at the next entry
  // after r.
  if (f < ef)
    return f;

  // No entry contains r; no entry contains runes > r.
  return NULL;
}